

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

void inbound_frame_set_settings_entry(nghttp2_inbound_frame *iframe)

{
  long lVar1;
  ulong local_28;
  size_t i;
  nghttp2_settings_entry *min_header_table_size_entry;
  nghttp2_settings_entry iv;
  nghttp2_inbound_frame *iframe_local;
  
  iv = (nghttp2_settings_entry)iframe;
  nghttp2_frame_unpack_settings_entry
            ((nghttp2_settings_entry *)&min_header_table_size_entry,(iframe->sbuf).pos);
  if (((int)min_header_table_size_entry - 1U < 6) ||
     ((int)min_header_table_size_entry == 8 || (int)min_header_table_size_entry == 9)) {
    for (local_28 = 0; local_28 < *(ulong *)((long)iv + 0xc0); local_28 = local_28 + 1) {
      if (*(int *)(*(long *)((long)iv + 0x60) + local_28 * 8) == (int)min_header_table_size_entry) {
        *(ulong *)(*(long *)((long)iv + 0x60) + local_28 * 8) =
             CONCAT44(min_header_table_size_entry._4_4_,(int)min_header_table_size_entry);
        break;
      }
    }
    if (local_28 == *(ulong *)((long)iv + 0xc0)) {
      lVar1 = *(long *)((long)iv + 0xc0);
      *(long *)((long)iv + 0xc0) = lVar1 + 1;
      *(ulong *)(*(long *)((long)iv + 0x60) + lVar1 * 8) =
           CONCAT44(min_header_table_size_entry._4_4_,(int)min_header_table_size_entry);
    }
    if (((int)min_header_table_size_entry == 1) &&
       (lVar1 = *(long *)((long)iv + 0x60) + (*(long *)((long)iv + 200) + -1) * 8,
       min_header_table_size_entry._4_4_ < *(uint *)(lVar1 + 4))) {
      *(uint *)(lVar1 + 4) = min_header_table_size_entry._4_4_;
    }
  }
  else {
    lVar1 = *(long *)((long)iv + 0xc0);
    *(long *)((long)iv + 0xc0) = lVar1 + 1;
    *(ulong *)(*(long *)((long)iv + 0x60) + lVar1 * 8) =
         CONCAT44(min_header_table_size_entry._4_4_,(int)min_header_table_size_entry);
  }
  return;
}

Assistant:

static void inbound_frame_set_settings_entry(nghttp2_inbound_frame *iframe) {
  nghttp2_settings_entry iv;
  nghttp2_settings_entry *min_header_table_size_entry;
  size_t i;

  nghttp2_frame_unpack_settings_entry(&iv, iframe->sbuf.pos);

  switch (iv.settings_id) {
  case NGHTTP2_SETTINGS_HEADER_TABLE_SIZE:
  case NGHTTP2_SETTINGS_ENABLE_PUSH:
  case NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS:
  case NGHTTP2_SETTINGS_INITIAL_WINDOW_SIZE:
  case NGHTTP2_SETTINGS_MAX_FRAME_SIZE:
  case NGHTTP2_SETTINGS_MAX_HEADER_LIST_SIZE:
  case NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL:
  case NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES:
    break;
  default:
    DEBUGF("recv: unknown settings id=0x%02x\n", iv.settings_id);

    iframe->iv[iframe->niv++] = iv;

    return;
  }

  for (i = 0; i < iframe->niv; ++i) {
    if (iframe->iv[i].settings_id == iv.settings_id) {
      iframe->iv[i] = iv;
      break;
    }
  }

  if (i == iframe->niv) {
    iframe->iv[iframe->niv++] = iv;
  }

  if (iv.settings_id == NGHTTP2_SETTINGS_HEADER_TABLE_SIZE) {
    /* Keep track of minimum value of SETTINGS_HEADER_TABLE_SIZE */
    min_header_table_size_entry = &iframe->iv[iframe->max_niv - 1];

    if (iv.value < min_header_table_size_entry->value) {
      min_header_table_size_entry->value = iv.value;
    }
  }
}